

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

void __thiscall Hand::~Hand(Hand *this)

{
  _Vector_base<CardType,_std::allocator<CardType>_> *this_00;
  
  this_00 = &this->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>;
  if (this_00 != (_Vector_base<CardType,_std::allocator<CardType>_> *)0x0) {
    std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  return;
}

Assistant:

Hand::~Hand() {
    delete handPointer;
}